

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsimd.c
# Opt level: O0

void jsimd_rgb_ycc_convert
               (j_compress_ptr cinfo,JSAMPARRAY input_buf,JSAMPIMAGE output_buf,
               JDIMENSION output_row,int num_rows)

{
  undefined4 in_ECX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  long in_RDI;
  undefined4 in_R8D;
  _func_void_JDIMENSION_JSAMPARRAY_JSAMPIMAGE_JDIMENSION_int *sse2fct;
  _func_void_JDIMENSION_JSAMPARRAY_JSAMPIMAGE_JDIMENSION_int *avx2fct;
  code *local_30;
  code *local_28;
  
  switch(*(undefined4 *)(in_RDI + 0x3c)) {
  case 6:
    local_28 = jsimd_extrgb_ycc_convert_avx2;
    local_30 = jsimd_extrgb_ycc_convert_sse2;
    break;
  case 7:
  case 0xc:
    local_28 = jsimd_extrgbx_ycc_convert_avx2;
    local_30 = jsimd_extrgbx_ycc_convert_sse2;
    break;
  case 8:
    local_28 = jsimd_extbgr_ycc_convert_avx2;
    local_30 = jsimd_extbgr_ycc_convert_sse2;
    break;
  case 9:
  case 0xd:
    local_28 = jsimd_extbgrx_ycc_convert_avx2;
    local_30 = jsimd_extbgrx_ycc_convert_sse2;
    break;
  case 10:
  case 0xe:
    local_28 = jsimd_extxbgr_ycc_convert_avx2;
    local_30 = jsimd_extxbgr_ycc_convert_sse2;
    break;
  case 0xb:
  case 0xf:
    local_28 = jsimd_extxrgb_ycc_convert_avx2;
    local_30 = jsimd_extxrgb_ycc_convert_sse2;
    break;
  default:
    local_28 = jsimd_rgb_ycc_convert_avx2;
    local_30 = jsimd_rgb_ycc_convert_sse2;
  }
  if ((simd_support & 0x80) == 0) {
    (*local_30)(*(undefined4 *)(in_RDI + 0x30),in_RSI,in_RDX,in_ECX,in_R8D);
  }
  else {
    (*local_28)(*(undefined4 *)(in_RDI + 0x30),in_RSI,in_RDX,in_ECX,in_R8D);
  }
  return;
}

Assistant:

GLOBAL(void)
jsimd_rgb_ycc_convert(j_compress_ptr cinfo, JSAMPARRAY input_buf,
                      JSAMPIMAGE output_buf, JDIMENSION output_row,
                      int num_rows)
{
  void (*avx2fct) (JDIMENSION, JSAMPARRAY, JSAMPIMAGE, JDIMENSION, int);
  void (*sse2fct) (JDIMENSION, JSAMPARRAY, JSAMPIMAGE, JDIMENSION, int);

  switch (cinfo->in_color_space) {
  case JCS_EXT_RGB:
    avx2fct = jsimd_extrgb_ycc_convert_avx2;
    sse2fct = jsimd_extrgb_ycc_convert_sse2;
    break;
  case JCS_EXT_RGBX:
  case JCS_EXT_RGBA:
    avx2fct = jsimd_extrgbx_ycc_convert_avx2;
    sse2fct = jsimd_extrgbx_ycc_convert_sse2;
    break;
  case JCS_EXT_BGR:
    avx2fct = jsimd_extbgr_ycc_convert_avx2;
    sse2fct = jsimd_extbgr_ycc_convert_sse2;
    break;
  case JCS_EXT_BGRX:
  case JCS_EXT_BGRA:
    avx2fct = jsimd_extbgrx_ycc_convert_avx2;
    sse2fct = jsimd_extbgrx_ycc_convert_sse2;
    break;
  case JCS_EXT_XBGR:
  case JCS_EXT_ABGR:
    avx2fct = jsimd_extxbgr_ycc_convert_avx2;
    sse2fct = jsimd_extxbgr_ycc_convert_sse2;
    break;
  case JCS_EXT_XRGB:
  case JCS_EXT_ARGB:
    avx2fct = jsimd_extxrgb_ycc_convert_avx2;
    sse2fct = jsimd_extxrgb_ycc_convert_sse2;
    break;
  default:
    avx2fct = jsimd_rgb_ycc_convert_avx2;
    sse2fct = jsimd_rgb_ycc_convert_sse2;
    break;
  }

  if (simd_support & JSIMD_AVX2)
    avx2fct(cinfo->image_width, input_buf, output_buf, output_row, num_rows);
  else
    sse2fct(cinfo->image_width, input_buf, output_buf, output_row, num_rows);
}